

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_window.cc
# Opt level: O0

void anon_unknown.dwarf_20a76::MakeTrapezoidal
               (bool periodic,vector<double,_std::allocator<double>_> *window)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  iterator __first;
  vector<double,_std::allocator<double>_> *in_RSI;
  byte in_DIL;
  double dVar5;
  double dVar6;
  int i_1;
  int i;
  double *w;
  double slope;
  int quarter_size;
  int size;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffa8;
  int local_2c;
  
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  iVar1 = (int)sVar3;
  dVar5 = round((double)iVar1 * 0.25);
  iVar2 = iVar1;
  if ((in_DIL & 1) == 0) {
    iVar2 = iVar1 + -1;
  }
  dVar6 = (double)iVar2;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  for (local_2c = 0; local_2c < (int)dVar5; local_2c = local_2c + 1) {
    pvVar4[local_2c] = (4.0 / dVar6) * (double)local_2c;
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            (in_stack_ffffffffffffffa8,CONCAT44(in_stack_ffffffffffffffa4,iVar2));
  __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff98);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator-
            (in_stack_ffffffffffffffa8,CONCAT44(in_stack_ffffffffffffffa4,iVar2));
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             0x3ff0000000000000,(double *)CONCAT44(in_stack_ffffffffffffffa4,iVar2));
  for (iVar2 = iVar1 - (int)dVar5; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    pvVar4[iVar2] = -(4.0 / dVar6) * (double)iVar2 + 4.0;
  }
  return;
}

Assistant:

void MakeTrapezoidal(bool periodic, std::vector<double>* window) {
  const int size(static_cast<int>(window->size()));
  const int quarter_size(static_cast<int>(std::round(0.25 * size)));
  const double slope(4.0 / (periodic ? size : size - 1));
  double* w(&((*window)[0]));
  for (int i(0); i < quarter_size; ++i) {
    w[i] = slope * i;
  }
  std::fill(window->begin() + quarter_size, window->end() - quarter_size, 1.0);
  for (int i(size - quarter_size); i < size; ++i) {
    w[i] = 4.0 - slope * i;
  }
}